

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddBezierCurve
          (ImDrawList *this,ImVec2 *pos0,ImVec2 *cp0,ImVec2 *cp1,ImVec2 *pos1,ImU32 col,
          float thickness,int num_segments)

{
  ImDrawList *in_RCX;
  ImVec2 *in_RDI;
  undefined8 in_R8;
  float in_R9D;
  undefined4 in_XMM0_Da;
  
  if (((uint)in_R9D & 0xff000000) != 0) {
    PathLineTo((ImDrawList *)CONCAT44(in_R9D,in_XMM0_Da),in_RDI);
    PathBezierCurveTo(this,pos0,cp0,cp1,pos1._4_4_);
    PathStroke(in_RCX,(ImU32)((ulong)in_R8 >> 0x20),SUB81((ulong)in_R8 >> 0x18,0),in_R9D);
  }
  return;
}

Assistant:

void ImDrawList::AddBezierCurve(const ImVec2& pos0, const ImVec2& cp0, const ImVec2& cp1, const ImVec2& pos1, ImU32 col, float thickness, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(pos0);
    PathBezierCurveTo(cp0, cp1, pos1, num_segments);
    PathStroke(col, false, thickness);
}